

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O1

GLuint __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOAttacher::getAttachment
          (BufferVAOAttacher *this,GLuint varr)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GLint name;
  GLuint local_1c;
  
  local_1c = 0;
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(varr);
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0xbe0))(0,0x889f,&local_1c);
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0xd8))(0);
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  err = (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x800))();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x11c);
  return local_1c;
}

Assistant:

GLuint BufferVAOAttacher::getAttachment (GLuint varr)
{
	GLint name = 0;
	gl().bindVertexArray(varr);
	gl().getVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &name);
	gl().bindVertexArray(0);
	GLU_CHECK_ERROR(gl().getError());
	return GLuint(name);
}